

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-param-util.h
# Opt level: O0

Test * __thiscall
testing::internal::
ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveHorizRSTest_Correctness_Test>::
CreateTest(ParameterizedTestFactory<(anonymous_namespace)::LowBDConvolveHorizRSTest_Correctness_Test>
           *this)

{
  Test *this_00;
  long in_RDI;
  
  WithParamInterface<std::tuple<void_(*)(const_unsigned_char_*,_int,_unsigned_char_*,_int,_int,_int,_const_short_*,_int,_int)>_>
  ::SetParam((ParamType *)(in_RDI + 8));
  this_00 = (Test *)operator_new(0x30);
  anon_unknown.dwarf_168b90f::LowBDConvolveHorizRSTest_Correctness_Test::
  LowBDConvolveHorizRSTest_Correctness_Test((LowBDConvolveHorizRSTest_Correctness_Test *)this_00);
  return this_00;
}

Assistant:

Test* CreateTest() override {
    TestClass::SetParam(&parameter_);
    return new TestClass();
  }